

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::TextureCubeGenMipmapCase::init
          (TextureCubeGenMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TextureCube *this_00;
  NotSupportedError *this_01;
  int local_e8;
  int local_e4;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  if (this->m_size * 3 <= *(int *)CONCAT44(extraout_var,iVar1)) {
    iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    iVar1 = this->m_size;
    if (iVar1 * 2 <= *(int *)(CONCAT44(extraout_var_00,iVar2) + 4)) {
      this_00 = (TextureCube *)operator_new(0x180);
      glu::TextureCube::TextureCube(this_00,this->m_renderCtx,this->m_format,this->m_dataType,iVar1)
      ;
      this->m_texture = this_00;
      return extraout_EAX;
    }
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_e4 = this->m_size * 3;
  de::toString<int>(&local_c0,&local_e4);
  std::operator+(&local_a0,"Render target size must be at least (",&local_c0);
  std::operator+(&local_80,&local_a0,", ");
  local_e8 = this->m_size * 2;
  de::toString<int>(&local_e0,&local_e8);
  std::operator+(&local_60,&local_80,&local_e0);
  std::operator+(&local_40,&local_60,")");
  tcu::NotSupportedError::NotSupportedError(this_01,&local_40);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureCubeGenMipmapCase::init (void)
{
	if (m_renderCtx.getRenderTarget().getWidth() < 3*m_size || m_renderCtx.getRenderTarget().getHeight() < 2*m_size)
		throw tcu::NotSupportedError("Render target size must be at least (" + de::toString(3*m_size) + ", " + de::toString(2*m_size) + ")");

	DE_ASSERT(!m_texture);
	m_texture = new TextureCube(m_renderCtx, m_format, m_dataType, m_size);
}